

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O0

void h264_print_picparm(h264_picparm *picparm)

{
  int iVar1;
  uint *in_RDI;
  int j;
  int i_1;
  int i;
  uint local_14;
  uint local_10;
  uint local_c;
  
  printf("Picture parameter set:\n");
  printf("\tpic_parameter_set_id = %d\n",(ulong)*in_RDI);
  printf("\tseq_parameter_set_id = %d\n",(ulong)in_RDI[1]);
  printf("\tentropy_coding_mode_flag = %d\n",(ulong)in_RDI[2]);
  printf("\tbottom_field_pic_order_in_frame_present_flag = %d\n",(ulong)in_RDI[3]);
  printf("\tnum_slice_groups_minus1 = %d\n",(ulong)in_RDI[4]);
  if (in_RDI[4] != 0) {
    printf("\tslice_group_map_type = %d\n",(ulong)in_RDI[5]);
    switch(in_RDI[5]) {
    case 0:
      for (local_c = 0; local_c <= in_RDI[4]; local_c = local_c + 1) {
        printf("\trun_length_minus1[%d] = %d\n",(ulong)local_c,(ulong)in_RDI[(long)(int)local_c + 6]
              );
      }
      break;
    case 1:
      break;
    case 2:
      for (local_c = 0; local_c < in_RDI[4]; local_c = local_c + 1) {
        printf("\ttop_left[%d] = %d\n",(ulong)local_c,(ulong)in_RDI[(long)(int)local_c + 0xe]);
        printf("\tbottom_right[%d] = %d\n",(ulong)local_c,(ulong)in_RDI[(long)(int)local_c + 0x16]);
      }
      break;
    case 3:
    case 4:
    case 5:
      printf("\tslice_group_change_direction_flag = %d\n",(ulong)in_RDI[0x1e]);
      printf("\tslice_group_change_rate_minus1 = %d\n",(ulong)in_RDI[0x1f]);
      break;
    case 6:
      printf("\tpic_size_in_map_units_minus1 = %d\n",(ulong)in_RDI[0x20]);
      for (local_c = 0; local_c <= in_RDI[0x20]; local_c = local_c + 1) {
        printf("\tslice_group_id[%d] = %d\n",(ulong)local_c,
               (ulong)*(uint *)(*(long *)(in_RDI + 0x22) + (long)(int)local_c * 4));
      }
    }
  }
  printf("\tnum_ref_idx_l0_default_active_minus1 = %d\n",(ulong)in_RDI[0x24]);
  printf("\tnum_ref_idx_l1_default_active_minus1 = %d\n",(ulong)in_RDI[0x25]);
  printf("\tweighted_pred_flag = %d\n",(ulong)in_RDI[0x26]);
  printf("\tweighted_bipred_idc = %d\n",(ulong)in_RDI[0x27]);
  printf("\tpic_init_qp_minus26 = %d\n",(ulong)in_RDI[0x28]);
  printf("\tpic_init_qs_minus26 = %d\n",(ulong)in_RDI[0x29]);
  printf("\tchroma_qp_index_offset = %d\n",(ulong)in_RDI[0x2a]);
  printf("\tdeblocking_filter_control_present_flag = %d\n",(ulong)in_RDI[0x2b]);
  printf("\tconstrained_intra_pred_flag = %d\n",(ulong)in_RDI[0x2c]);
  printf("\tredundant_pic_cnt_present_flag = %d\n",(ulong)in_RDI[0x2d]);
  printf("\ttransform_8x8_mode_flag = %d\n",(ulong)in_RDI[0x2e]);
  printf("\tpic_scaling_matrix_present_flag = %d\n",(ulong)in_RDI[0x30]);
  if (in_RDI[0x30] != 0) {
    local_10 = 0;
    while( true ) {
      iVar1 = 8;
      if (in_RDI[0x2f] == 3) {
        iVar1 = 0xc;
      }
      if (iVar1 <= (int)local_10) break;
      printf("\tpic_scaling_list_present_flag[%d] = %d\n",(ulong)local_10,
             (ulong)in_RDI[(long)(int)local_10 + 0x31]);
      if ((in_RDI[(long)(int)local_10 + 0x31] != 0) &&
         (printf("\tuse_default_scaling_matrix_flag[%d] = %d\n",(ulong)local_10,
                 (ulong)in_RDI[(long)(int)local_10 + 0x3d]), in_RDI[(long)(int)local_10 + 0x3d] == 0
         )) {
        local_14 = 0;
        while( true ) {
          iVar1 = 0x40;
          if ((int)local_10 < 6) {
            iVar1 = 0x10;
          }
          if (iVar1 <= (int)local_14) break;
          if ((int)local_10 < 6) {
            printf("\tpic_scaling_list[%d][%d] = %d\n",(ulong)local_10,(ulong)local_14,
                   (ulong)in_RDI[(long)(int)local_10 * 0x10 + (long)(int)local_14 + 0x49]);
          }
          else {
            printf("\tpic_scaling_list[%d][%d] = %d\n",(ulong)local_10,(ulong)local_14,
                   (ulong)in_RDI[(long)(int)(local_10 - 6) * 0x40 + (long)(int)local_14 + 0xa9]);
          }
          local_14 = local_14 + 1;
        }
      }
      local_10 = local_10 + 1;
    }
  }
  printf("\tsecond_chroma_qp_index_offset = %d\n",(ulong)in_RDI[0x229]);
  return;
}

Assistant:

void h264_print_picparm(struct h264_picparm *picparm) {
	printf("Picture parameter set:\n");
	printf ("\tpic_parameter_set_id = %d\n", picparm->pic_parameter_set_id);
	printf ("\tseq_parameter_set_id = %d\n", picparm->seq_parameter_set_id);
	printf ("\tentropy_coding_mode_flag = %d\n", picparm->entropy_coding_mode_flag);
	printf ("\tbottom_field_pic_order_in_frame_present_flag = %d\n", picparm->bottom_field_pic_order_in_frame_present_flag);
	printf ("\tnum_slice_groups_minus1 = %d\n", picparm->num_slice_groups_minus1);
	if (picparm->num_slice_groups_minus1) {
		int i;
		printf ("\tslice_group_map_type = %d\n", picparm->slice_group_map_type);
		switch (picparm->slice_group_map_type) {
			case H264_SLICE_GROUP_MAP_INTERLEAVED:
				for (i = 0; i <= picparm->num_slice_groups_minus1; i++) {
					printf ("\trun_length_minus1[%d] = %d\n", i, picparm->run_length_minus1[i]);

				}
				break;
			case H264_SLICE_GROUP_MAP_DISPERSED:
				break;
			case H264_SLICE_GROUP_MAP_FOREGROUND:
				for (i = 0; i < picparm->num_slice_groups_minus1; i++) {
					printf ("\ttop_left[%d] = %d\n", i, picparm->top_left[i]);
					printf ("\tbottom_right[%d] = %d\n", i, picparm->bottom_right[i]);

				}
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_BOX:
			case H264_SLICE_GROUP_MAP_CHANGING_VERTICAL:
			case H264_SLICE_GROUP_MAP_CHANGING_HORIZONTAL:
				printf ("\tslice_group_change_direction_flag = %d\n", picparm->slice_group_change_direction_flag);
				printf ("\tslice_group_change_rate_minus1 = %d\n", picparm->slice_group_change_rate_minus1);
				break;
			case H264_SLICE_GROUP_MAP_EXPLICIT:
				printf ("\tpic_size_in_map_units_minus1 = %d\n", picparm->pic_size_in_map_units_minus1);
				for (i = 0; i <= picparm->pic_size_in_map_units_minus1; i++)
					printf ("\tslice_group_id[%d] = %d\n", i, picparm->slice_group_id[i]);
				break;
		}
	}
	printf ("\tnum_ref_idx_l0_default_active_minus1 = %d\n", picparm->num_ref_idx_l0_default_active_minus1);
	printf ("\tnum_ref_idx_l1_default_active_minus1 = %d\n", picparm->num_ref_idx_l1_default_active_minus1);
	printf ("\tweighted_pred_flag = %d\n", picparm->weighted_pred_flag);
	printf ("\tweighted_bipred_idc = %d\n", picparm->weighted_bipred_idc);
	printf ("\tpic_init_qp_minus26 = %d\n", picparm->pic_init_qp_minus26);
	printf ("\tpic_init_qs_minus26 = %d\n", picparm->pic_init_qs_minus26);
	printf ("\tchroma_qp_index_offset = %d\n", picparm->chroma_qp_index_offset);
	printf ("\tdeblocking_filter_control_present_flag = %d\n", picparm->deblocking_filter_control_present_flag);
	printf ("\tconstrained_intra_pred_flag = %d\n", picparm->constrained_intra_pred_flag);
	printf ("\tredundant_pic_cnt_present_flag = %d\n", picparm->redundant_pic_cnt_present_flag);
	printf ("\ttransform_8x8_mode_flag = %d\n", picparm->transform_8x8_mode_flag);
	printf ("\tpic_scaling_matrix_present_flag = %d\n", picparm->pic_scaling_matrix_present_flag);
	if (picparm->pic_scaling_matrix_present_flag) {
		int i, j;
		for (i = 0; i < (picparm->chroma_format_idc == 3 ? 12 : 8); i++) {
			printf ("\tpic_scaling_list_present_flag[%d] = %d\n", i, picparm->pic_scaling_list_present_flag[i]);
			if (picparm->pic_scaling_list_present_flag[i]) {
				printf ("\tuse_default_scaling_matrix_flag[%d] = %d\n", i, picparm->use_default_scaling_matrix_flag[i]);
				if (!picparm->use_default_scaling_matrix_flag[i]) {
					for (j = 0; j < (i < 6 ? 16 : 64); j++) {
						if (i < 6)
							printf ("\tpic_scaling_list[%d][%d] = %d\n", i, j, picparm->pic_scaling_list_4x4[i][j]);
						else
							printf ("\tpic_scaling_list[%d][%d] = %d\n", i, j, picparm->pic_scaling_list_8x8[i-6][j]);
					}
				}
			}
		}
	}
	printf ("\tsecond_chroma_qp_index_offset = %d\n", picparm->second_chroma_qp_index_offset);
}